

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O1

void stressing_multi_threads(int threadNum)

{
  ulong uVar1;
  long lVar2;
  shared_ptr<Thread> tmp;
  vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> vsp;
  undefined1 local_5d;
  uint local_5c;
  value_type local_58;
  vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-------------------stressing test multi thread------------------",0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  local_48.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c = threadNum;
  if (0 < threadNum) {
    do {
      local_58.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Thread,std::allocator<Thread>,void(&)(),char_const(&)[9]>
                (&local_58.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Thread **)&local_58,(allocator<Thread> *)&local_5d,threadFunc,
                 (char (*) [9])"testFunc");
      std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::push_back
                (&local_48,&local_58);
      if (local_58.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
      }
      threadNum = threadNum + -1;
    } while (threadNum != 0);
  }
  if (0 < (int)local_5c) {
    uVar1 = (ulong)local_5c;
    lVar2 = 0;
    do {
      Thread::start(*(Thread **)
                     ((long)&((local_48.
                               super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar2)
                   );
      lVar2 = lVar2 + 0x10;
    } while (uVar1 << 4 != lVar2);
  }
  sleep(3);
  std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::~vector
            (&local_48);
  return;
}

Assistant:

void stressing_multi_threads(int threadNum =4){
    // threadNum * 100000 lines
    cout<<"-------------------stressing test multi thread------------------"<<endl;
    vector<shared_ptr<Thread>> vsp;
    for (int i=0; i<threadNum; ++i) {
        shared_ptr<Thread> tmp = make_shared<Thread>(threadFunc, "testFunc");
        vsp.push_back(tmp);
    }   
    for (int i=0; i<threadNum; ++i) {
        vsp[i]->start();
    }
    sleep(3);
}